

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

void __thiscall f8n::db::Statement::BindTextW(Statement *this,int position,wchar_t *bindText)

{
  sqlite3_bind_text16(this->stmt,position + 1,bindText,-1,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

void Statement::BindTextW(int position, const wchar_t* bindText) {
    sqlite3_bind_text16(
        this->stmt,
        position + 1,
        bindText,
        -1,
        SQLITE_STATIC);
}